

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect3.c
# Opt level: O3

lws * lws_client_connect_3_connect(lws *wsi,char *ads,addrinfo *result,int n,void *opaque)

{
  ushort uVar1;
  lws_sockfd_type sfd;
  lws_dll2 *d;
  _func_int_lws_ptr *p_Var2;
  lws_vhost *plVar3;
  lws_protocols *plVar4;
  lws_dll2 *plVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  lws_log_cx *plVar10;
  size_t sVar11;
  lws_usec_t lVar12;
  lws *plVar13;
  uint uVar14;
  lws_context *plVar15;
  char *pcVar16;
  ulong uVar17;
  sockaddr *__addr;
  socklen_t salen;
  int e;
  char nads [48];
  socklen_t *in_stack_fffffffffffffef8;
  undefined4 uVar19;
  undefined8 uVar18;
  socklen_t local_ec;
  sockaddr local_e8 [6];
  undefined1 local_7b;
  socklen_t local_78 [18];
  
  uVar1 = wsi->conn_port;
  if (result != (addrinfo *)0x0) {
    lws_sul_cancel(&wsi->sul_connect_timeout);
    lws_conmon_append_copy_new_dns_results(wsi,result);
    lws_sort_dns(wsi,result);
    freeaddrinfo((addrinfo *)result);
  }
  iVar7 = lws_dll2_is_detached(&wsi->dll2_cli_txn_queue);
  uVar19 = (undefined4)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  if (iVar7 != 0) {
    if ((((n == 0) || ((wsi->dns_sorted_list).count != 0)) || ((wsi->desc).sockfd != -1)) ||
       ((wsi->speculative_connect_owner).count != 0)) {
      if (((short)wsi->wsistate != 0x202) || ((wsi->desc).sockfd == -1)) {
        if (ads == (char *)0x0) goto LAB_0011a18c;
        if (*ads != '+') goto LAB_0011a18c;
        in_stack_fffffffffffffef8 = (socklen_t *)(ads + 1);
        *(undefined8 *)&wsi->sa46_peer = 0;
        *(undefined8 *)((long)&wsi->sa46_peer + 8) = 0;
        local_e8[0].sa_family = 1;
        strncpy(local_e8[0].sa_data,(char *)in_stack_fffffffffffffef8,0x6c);
        local_7b = 0;
        plVar10 = lwsl_wsi_get_cx(wsi);
        __addr = (sockaddr *)0x0;
        _lws_log_cx(plVar10,lws_log_prepend_wsi,wsi,8,"lws_client_connect_3_connect","Unix skt: %s",
                    in_stack_fffffffffffffef8);
        if (local_e8[0].sa_data[0] != '@') goto LAB_0011a223;
        local_e8[0].sa_data[0] = '\0';
        __addr = (sockaddr *)0x0;
        goto LAB_0011a223;
      }
      if (((wsi->dns_sorted_list).count == 0) &&
         ((wsi->sul_connect_timeout).list.owner == (lws_dll2_owner *)0x0)) {
        plVar10 = lwsl_wsi_get_cx(wsi);
        pcVar16 = "abandoning connect due to timeout";
        goto LAB_0011a4fa;
      }
      local_78[0] = 4;
      iVar8 = getsockopt((wsi->desc).sockfd,1,4,local_e8,local_78);
      iVar7 = 0;
      if (iVar8 == 0) {
        piVar9 = __errno_location();
        uVar6 = local_e8[0]._0_4_;
        iVar7 = *piVar9;
        plVar10 = lwsl_wsi_get_cx(wsi);
        if (uVar6 == 0) {
          _lws_log_cx(plVar10,lws_log_prepend_wsi,wsi,0x10,"lws_client_connect_check",
                      "getsockopt: conn OK errno %d",CONCAT44(uVar19,iVar7));
LAB_0011a6a9:
          lVar12 = lws_now_usecs();
          (wsi->conmon).ciu_sockconn = (int)lVar12 - (int)wsi->conmon_datum;
          local_ec = 0x10;
          iVar7 = getsockname((wsi->desc).sockfd,(sockaddr *)&(wsi->sa46_local).sa4,&local_ec);
          if (iVar7 == -1) {
            piVar9 = __errno_location();
            pcVar16 = strerror(*piVar9);
            _lws_log(2,"getsockname: %s\n",pcVar16);
          }
          if ((*(ulong *)&wsi->field_0x46e & 0x800000000) == 0) {
            lws_sa46_write_numeric_address(&wsi->sa46_local,(char *)local_78,0x40);
          }
          else {
            local_78[0] = local_78[0] & 0xffffff00;
          }
          plVar10 = lwsl_wsi_get_cx(wsi);
          _lws_log_cx(plVar10,lws_log_prepend_wsi,wsi,8,"lws_client_connect_3_connect",
                      "source ads %s",local_78);
          lws_sul_cancel(&wsi->sul_connect_timeout);
          lws_addrinfo_clean(wsi);
          plVar4 = (wsi->a).protocol;
          if (plVar4 != (lws_protocols *)0x0) {
            (*plVar4->callback)(wsi,LWS_CALLBACK_WSI_CREATE,wsi->user_space,(void *)0x0,0);
          }
          plVar10 = lwsl_wsi_get_cx(wsi);
          _lws_log_cx(plVar10,lws_log_prepend_wsi,wsi,0x10,"lws_client_connect_3_connect",
                      "going into connect_4");
          plVar13 = lws_client_connect_4_established(wsi,(lws *)0x0,0);
          return plVar13;
        }
        uVar18 = CONCAT44(uVar19,(wsi->desc).sockfd);
        _lws_log_cx(plVar10,lws_log_prepend_wsi,wsi,4,"lws_client_connect_check",
                    "getsockopt fd %d says err %d",uVar18,local_e8[0]._0_4_);
        uVar19 = (undefined4)((ulong)uVar18 >> 0x20);
      }
      plVar10 = lwsl_wsi_get_cx(wsi);
      uVar18 = CONCAT44(uVar19,iVar7);
      _lws_log_cx(plVar10,lws_log_prepend_wsi,wsi,4,"lws_client_connect_check",
                  "connect check take as FAILED: errno %d",uVar18);
      uVar14 = (uint)((ulong)uVar18 >> 0x20);
      plVar10 = lwsl_wsi_get_cx(wsi);
      __errno_location();
      in_stack_fffffffffffffef8 = (socklen_t *)((ulong)uVar14 << 0x20);
      pcVar16 = "getsockopt check: conn fail: errno %d";
      iVar7 = 0x10;
      do {
        _lws_log_cx(plVar10,lws_log_prepend_wsi,wsi,iVar7,"lws_client_connect_3_connect",pcVar16);
LAB_0011a50c:
        do {
          do {
            do {
              __remove_wsi_socket_from_fds(wsi);
LAB_0011a514:
              do {
                while( true ) {
                  close((wsi->desc).sockfd);
                  (wsi->desc).sockfd = -1;
                  while( true ) {
                    uVar19 = (undefined4)((ulong)in_stack_fffffffffffffef8 >> 0x20);
                    lws_sul_cancel(&wsi->sul_connect_timeout);
                    if ((wsi->dns_sorted_list).head == (lws_dll2 *)0x0) {
                      lws_addrinfo_clean(wsi);
                      lws_inform_client_conn_fail(wsi,"Unable to connect",0x11);
                      goto LAB_0011a843;
                    }
LAB_0011a18c:
                    if ((wsi->dns_sorted_list).count == 0) goto LAB_0011a843;
                    d = (wsi->dns_sorted_list).head;
                    lws_dll2_remove(d);
                    __addr = (sockaddr *)&wsi->sa46_peer;
                    plVar5 = d[2].prev;
                    *(lws_dll2_owner **)&wsi->sa46_peer = d[1].owner;
                    *(lws_dll2 **)((long)&wsi->sa46_peer + 8) = plVar5;
                    wsi->peer_route_uidx = *(lws_route_uidx_t *)&d[4].prev;
                    plVar10 = lwsl_wsi_get_cx(wsi);
                    in_stack_fffffffffffffef8 =
                         (socklen_t *)CONCAT44(uVar19,(uint)wsi->peer_route_uidx);
                    _lws_log_cx(plVar10,lws_log_prepend_wsi,wsi,8,"lws_client_connect_3_connect",
                                "peer_route_uidx %d",in_stack_fffffffffffffef8);
                    lws_realloc(d,0,"lws_free");
                    (wsi->sa46_peer).sa4.sin_port = uVar1 << 8 | uVar1 >> 8;
                    n = 0x10;
LAB_0011a223:
                    if ((wsi->desc).sockfd != -1) goto LAB_0011a22c;
                    p_Var2 = ((wsi->a).context)->event_loop_ops->check_client_connect_ok;
                    if ((p_Var2 != (_func_int_lws_ptr *)0x0) && (iVar7 = (*p_Var2)(wsi), iVar7 != 0)
                       ) {
                      if (((wsi->wsistate & 0x10000000) != 0) &&
                         ((wsi->a).protocol != (lws_protocols *)0x0)) {
                        lws_inform_client_conn_fail
                                  (wsi,"waiting for event loop watcher to close",0x27);
                      }
                      if (wsi->position_in_fds_table == -1) {
                        plVar3 = (wsi->a).vhost;
                        sfd = (wsi->desc).sockfd;
                        __lws_free_wsi(wsi);
                        sanity_assert_no_wsi_traces(plVar3->context,wsi);
                        sanity_assert_no_sockfd_traces(plVar3->context,sfd);
                        return (lws *)0x0;
                      }
                      goto LAB_0011a843;
                    }
                    uVar14 = 1;
                    if ((*(ulong *)&wsi->field_0x46e & 0x800000000) == 0) {
                      uVar14 = (uint)(wsi->sa46_peer).sa4.sin_family;
                    }
                    iVar7 = socket(uVar14,1,0);
                    (wsi->desc).sockfd = iVar7;
                    if (iVar7 != -1) break;
                    plVar10 = lwsl_wsi_get_cx(wsi);
                    _lws_log_cx(plVar10,lws_log_prepend_wsi,wsi,2,"lws_client_connect_3_connect",
                                "Unable to open socket");
                  }
                  iVar7 = lws_plat_set_socket_options
                                    ((wsi->a).vhost,iVar7,
                                     (uint)((ulong)*(undefined8 *)&wsi->field_0x46e >> 0x23) & 1);
                  if (iVar7 == 0) break;
                  plVar10 = lwsl_wsi_get_cx(wsi);
                  _lws_log_cx(plVar10,lws_log_prepend_wsi,wsi,1,"lws_client_connect_3_connect",
                              "Failed to set wsi socket options");
                }
                iVar7 = lws_plat_set_socket_options_ip((wsi->desc).sockfd,wsi->c_pri,wsi->flags);
                if (iVar7 != 0) {
                  plVar10 = lwsl_wsi_get_cx(wsi);
                  _lws_log_cx(plVar10,lws_log_prepend_wsi,wsi,2,"lws_client_connect_3_connect",
                              "unable to set ip options");
                }
                plVar10 = lwsl_wsi_get_cx(wsi);
                _lws_log_cx(plVar10,lws_log_prepend_wsi,wsi,0x10,"lws_client_connect_3_connect",
                            "WAITING_CONNECT");
                lwsi_set_state(wsi,0x202);
                plVar15 = (wsi->a).context;
                p_Var2 = plVar15->event_loop_ops->sock_accept;
                if (p_Var2 != (_func_int_lws_ptr *)0x0) {
                  iVar7 = (*p_Var2)(wsi);
                  if (iVar7 != 0) goto LAB_0011a514;
                  plVar15 = (wsi->a).context;
                }
                iVar7 = __insert_wsi_socket_into_fds(plVar15,wsi);
              } while (iVar7 != 0);
              iVar7 = lws_change_pollfd(wsi,0,1);
            } while (iVar7 != 0);
            plVar3 = (wsi->a).vhost;
            if ((wsi->a).protocol == (lws_protocols *)0x0) {
              (wsi->a).protocol = plVar3->protocols;
            }
            lws_set_timeout(wsi,PENDING_TIMEOUT_AWAITING_CONNECT_RESPONSE,
                            plVar3->connect_timeout_secs);
            pcVar16 = lws_wsi_client_stash_item(wsi,6,0x5e);
          } while (((pcVar16 != (char *)0x0) && (*pcVar16 != '\0')) &&
                  (iVar7 = lws_socket_bind((wsi->a).vhost,wsi,(wsi->desc).sockfd,0,pcVar16,uVar14),
                  iVar7 < 0));
LAB_0011a22c:
          uVar19 = (undefined4)((ulong)in_stack_fffffffffffffef8 >> 0x20);
          uVar17 = *(ulong *)&wsi->field_0x46e;
          if ((uVar17 & 0x800000000) == 0) {
            if (__addr == (sockaddr *)0x0) goto LAB_0011a50c;
            memmove(&wsi->sa46_peer,__addr,(ulong)(uint)n);
            uVar17 = *(ulong *)&wsi->field_0x46e;
          }
          else {
            if (local_e8[0].sa_data[0] == '\0') {
              sVar11 = strlen(local_e8[0].sa_data + 1);
              n = (int)sVar11 + 3;
            }
            else {
              sVar11 = strlen(local_e8[0].sa_data);
              n = (int)sVar11 + 2;
            }
            __addr = local_e8;
          }
          *(ulong *)&wsi->field_0x46e = uVar17 & 0xffffffffffffefff;
          iVar7 = user_callback_handle_rxflow
                            (((wsi->a).protocol)->callback,wsi,LWS_CALLBACK_CONNECTING,
                             wsi->user_space,(void *)(long)(wsi->desc).sockfd,0);
          if (iVar7 != 0) {
            plVar10 = lwsl_wsi_get_cx(wsi);
            _lws_log_cx(plVar10,lws_log_prepend_wsi,wsi,8,"lws_client_connect_3_connect",
                        "CONNECTION CB closed");
LAB_0011a843:
            lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"client_connect3");
            return (lws *)0x0;
          }
          iVar7 = connect((wsi->desc).sockfd,__addr,n);
          lVar12 = lws_now_usecs();
          wsi->conmon_datum = lVar12;
          (wsi->conmon).ciu_sockconn = 0;
          if (iVar7 != -1) goto LAB_0011a6a9;
          piVar9 = __errno_location();
          iVar7 = *piVar9;
          plVar10 = lwsl_wsi_get_cx(wsi);
          in_stack_fffffffffffffef8 = (socklen_t *)CONCAT44(uVar19,(wsi->desc).sockfd);
          _lws_log_cx(plVar10,lws_log_prepend_wsi,wsi,0x10,"lws_client_connect_3_connect",
                      "connect: fd %d errno: %d",in_stack_fffffffffffffef8,iVar7);
          if (((iVar7 - 0x72U < 2) || (iVar7 == 0)) || (iVar7 == 0xb)) {
            plVar15 = (wsi->a).context;
            lws_sul_schedule(plVar15,0,&wsi->sul_connect_timeout,lws_client_conn_wait_timeout,
                             (ulong)plVar15->timeout_secs * 1000000);
            iVar7 = lws_change_pollfd(wsi,0,4);
            if (iVar7 == 0) {
              return wsi;
            }
            goto LAB_0011a50c;
          }
          lVar12 = lws_now_usecs();
          (wsi->conmon).ciu_sockconn = (int)lVar12 - (int)wsi->conmon_datum;
        } while ((*(ulong *)&wsi->field_0x46e & 0x800000000) != 0);
        in_stack_fffffffffffffef8 = local_78;
        lws_sa46_write_numeric_address(&wsi->sa46_peer,(char *)in_stack_fffffffffffffef8,0x30);
        (wsi->sa46_peer).sa4.sin_family = 0;
        plVar10 = lwsl_wsi_get_cx(wsi);
        pcVar16 = "Connect failed: %s port %d (errno %d)";
LAB_0011a4fa:
        iVar7 = 8;
      } while( true );
    }
    plVar10 = lwsl_wsi_get_cx(wsi);
    _lws_log_cx(plVar10,lws_log_prepend_wsi,wsi,4,"lws_client_connect_3_connect",
                "dns lookup failed %d",CONCAT44(uVar19,n));
    lwsi_set_state(wsi,0x200);
    lws_sul_schedule((wsi->a).context,0,&wsi->sul_connect_timeout,lws_client_dns_retry_timeout,
                     1000000);
  }
  return wsi;
}

Assistant:

struct lws *
lws_client_connect_3_connect(struct lws *wsi, const char *ads,
			     const struct addrinfo *result, int n, void *opaque)
{
#if defined(LWS_WITH_UNIX_SOCK)
	struct sockaddr_un sau;
#endif
	struct lws_context_per_thread *pt = &wsi->a.context->pt[(int)wsi->tsi];
	const struct sockaddr *psa = NULL;
	uint16_t port = wsi->conn_port;
	const char *cce, *iface;
	lws_dns_sort_t *curr;
	ssize_t plen = 0;
	lws_dll2_t *d;
#if defined(LWS_WITH_SYS_FAULT_INJECTION)
	int cfail;
#endif
	int m, af = 0;

	/*
	 * If we come here with result set, we need to convert getaddrinfo
	 * results to a lws_dns_sort_t list one time and free the results.
	 *
	 * We use this pattern because ASYNC_DNS will callback here with the
	 * results when it gets them (and may come here more than once, eg, for
	 * AAAA then A or vice-versa)
	 */

	if (result) {
		lws_sul_cancel(&wsi->sul_connect_timeout);

#if defined(LWS_WITH_CONMON)
		/* append a copy from before the sorting */
		lws_conmon_append_copy_new_dns_results(wsi, result);
#endif

		lws_sort_dns(wsi, result);
#if defined(LWS_WITH_SYS_ASYNC_DNS)
		lws_async_dns_freeaddrinfo(&result);
#else
		freeaddrinfo((struct addrinfo *)result);
#endif
		result = NULL;
	}

	/*
	 * async dns calls back here for everybody who cares when it gets a
	 * result... but if we are piggybacking, we do not want to connect
	 * ourselves
	 */

	if (!lws_dll2_is_detached(&wsi->dll2_cli_txn_queue))
		return wsi;

	if (n &&  /* calling back with a problem */
	    !wsi->dns_sorted_list.count && /* there's no results */
	    !lws_socket_is_valid(wsi->desc.sockfd) && /* no attempt ongoing */
	    !wsi->speculative_connect_owner.count /* no spec attempt */ ) {
		lwsl_wsi_notice(wsi, "dns lookup failed %d", n);

		/*
		 * DNS lookup itself failed... let's try again until we
		 * timeout
		 */

		lwsi_set_state(wsi, LRS_UNCONNECTED);
		lws_sul_schedule(wsi->a.context, 0, &wsi->sul_connect_timeout,
				 lws_client_dns_retry_timeout,
						 LWS_USEC_PER_SEC);
		return wsi;

//		cce = "dns lookup failed";
//		goto oom4;
	}

	/*
	 * We come back here again when we think the connect() may have
	 * completed one way or the other, we can't proceed until we know we
	 * actually connected.
	 */

	if (lwsi_state(wsi) == LRS_WAITING_CONNECT &&
	    lws_socket_is_valid(wsi->desc.sockfd)) {

		if (!wsi->dns_sorted_list.count &&
		    !wsi->sul_connect_timeout.list.owner)
			/* no dns results and no ongoing timeout for one */
			goto connect_to;

		switch (lws_client_connect_check(wsi)) {
		case LCCCR_CONNECTED:
			/*
			 * Oh, it has happened...
			 */
			goto conn_good;
		case LCCCR_CONTINUE:
			return NULL;
		default:
			lwsl_wsi_debug(wsi, "getsockopt check: conn fail: errno %d",
				       LWS_ERRNO);
			lws_metrics_caliper_report(wsi->cal_conn, METRES_NOGO);
			goto try_next_dns_result_fds;
		}
	}

#if defined(LWS_WITH_UNIX_SOCK)
	if (ads && *ads == '+') {
		ads++;
		memset(&wsi->sa46_peer, 0, sizeof(wsi->sa46_peer));
		memset(&sau, 0, sizeof(sau));
		af = sau.sun_family = AF_UNIX;
		strncpy(sau.sun_path, ads, sizeof(sau.sun_path));
		sau.sun_path[sizeof(sau.sun_path) - 1] = '\0';

		lwsl_wsi_info(wsi, "Unix skt: %s", ads);

		if (sau.sun_path[0] == '@')
			sau.sun_path[0] = '\0';

		goto ads_known;
	}
#endif

#if defined(LWS_WITH_SYS_ASYNC_DNS)
	if (n == LADNS_RET_FAILED) {
		lwsl_wsi_notice(wsi, "adns failed %s", ads);
		/*
		 * Caller that is giving us LADNS_RET_FAILED will deal
		 * with cleanup
		 */
		return NULL;
	}
#endif

	/*
	 * Let's try directly connecting to each of the results in turn until
	 * one works, or we run out of results...
	 *
	 * We have a sorted dll2 list with the head one most preferable
	 */

next_dns_result:

	if (!wsi->dns_sorted_list.count)
		goto failed1;

	/*
	 * Copy the wsi head sorted dns result into the wsi->sa46_peer, and
	 * remove and free the original from the sorted list
	 */

	d = lws_dll2_get_head(&wsi->dns_sorted_list);
	curr = lws_container_of(d, lws_dns_sort_t, list);

	lws_dll2_remove(&curr->list);
	wsi->sa46_peer = curr->dest;
#if defined(LWS_WITH_NETLINK)
	wsi->peer_route_uidx = curr->uidx;
	lwsl_wsi_info(wsi, "peer_route_uidx %d", wsi->peer_route_uidx);
#endif

	lws_free(curr);

	sa46_sockport(&wsi->sa46_peer, htons(port));

	psa = sa46_sockaddr(&wsi->sa46_peer);
	n = (int)sa46_socklen(&wsi->sa46_peer);

#if defined(LWS_WITH_UNIX_SOCK)
ads_known:
#endif

	/*
	 * Now we prepared psa, if not already connecting, create the related
	 * socket and add to the fds
	 */

	if (!lws_socket_is_valid(wsi->desc.sockfd)) {

		if (wsi->a.context->event_loop_ops->check_client_connect_ok &&
		    wsi->a.context->event_loop_ops->check_client_connect_ok(wsi)
		) {
			cce = "waiting for event loop watcher to close";
			goto oom4;
		}

#if defined(LWS_WITH_UNIX_SOCK)
		af = 0;
		if (wsi->unix_skt) {
			af = AF_UNIX;
			wsi->desc.sockfd = socket(AF_UNIX, SOCK_STREAM, 0);
		}
		else
#endif
		{
			af = wsi->sa46_peer.sa4.sin_family;
			wsi->desc.sockfd = socket(wsi->sa46_peer.sa4.sin_family,
						  SOCK_STREAM, 0);
		}

		if (!lws_socket_is_valid(wsi->desc.sockfd)) {
			lwsl_wsi_warn(wsi, "Unable to open socket");
			goto try_next_dns_result;
		}

		if (lws_plat_set_socket_options(wsi->a.vhost, wsi->desc.sockfd,
#if defined(LWS_WITH_UNIX_SOCK)
						wsi->unix_skt)) {
#else
						0)) {
#endif
			lwsl_wsi_err(wsi, "Failed to set wsi socket options");
			goto try_next_dns_result_closesock;
		}

		/* apply requested socket options */
		if (lws_plat_set_socket_options_ip(wsi->desc.sockfd,
						   wsi->c_pri, wsi->flags))
			lwsl_wsi_warn(wsi, "unable to set ip options");

		lwsl_wsi_debug(wsi, "WAITING_CONNECT");
		lwsi_set_state(wsi, LRS_WAITING_CONNECT);

		if (wsi->a.context->event_loop_ops->sock_accept)
			if (wsi->a.context->event_loop_ops->sock_accept(wsi))
				goto try_next_dns_result_closesock;

		lws_pt_lock(pt, __func__);
		if (__insert_wsi_socket_into_fds(wsi->a.context, wsi)) {
			lws_pt_unlock(pt);
			goto try_next_dns_result_closesock;
		}
		lws_pt_unlock(pt);

		/*
		 * The fd + wsi combination is entered into the wsi tables
		 * at this point, with a pollfd
		 *
		 * Past here, we can't simply free the structs as error
		 * handling as oom4 does.
		 *
		 * We can run the whole close flow, or unpick the fds inclusion
		 * and anything else we have done.
		 */

		if (lws_change_pollfd(wsi, 0, LWS_POLLIN))
			goto try_next_dns_result_fds;

		if (!wsi->a.protocol)
			wsi->a.protocol = &wsi->a.vhost->protocols[0];

		lws_set_timeout(wsi, PENDING_TIMEOUT_AWAITING_CONNECT_RESPONSE,
				wsi->a.vhost->connect_timeout_secs);

		iface = lws_wsi_client_stash_item(wsi, CIS_IFACE,
						  _WSI_TOKEN_CLIENT_IFACE);

		if (iface && *iface) {
			m = lws_socket_bind(wsi->a.vhost, wsi, wsi->desc.sockfd,
					    0, iface, af);
			if (m < 0)
				goto try_next_dns_result_fds;
		}
	}

#if defined(LWS_WITH_UNIX_SOCK)
	if (wsi->unix_skt) {
		psa = (const struct sockaddr *)&sau;
		if (sau.sun_path[0])
			n = (int)(sizeof(uint16_t) + strlen(sau.sun_path));
		else
			n = (int)(sizeof(uint16_t) +
					strlen(&sau.sun_path[1]) + 1);
	} else
#endif

	if (!psa) /* coverity */
		goto try_next_dns_result_fds;

	/*
	 * The actual connection attempt
	 */

#if defined(LWS_ESP_PLATFORM)
	errno = 0;
#endif

	/* grab a copy for peer tracking */
#if defined(LWS_WITH_UNIX_SOCK)
	if (!wsi->unix_skt)
#endif
		memmove(&wsi->sa46_peer, psa, (unsigned int)n);

	/*
	 * Finally, make the actual connection attempt
	 */

#if defined(LWS_WITH_SYS_METRICS)
	if (wsi->cal_conn.mt) {
		lws_metrics_caliper_report(wsi->cal_conn, METRES_NOGO);
	}
	lws_metrics_caliper_bind(wsi->cal_conn, wsi->a.context->mt_conn_tcp);
#endif

	wsi->socket_is_permanently_unusable = 0;

	if (lws_fi(&wsi->fic, "conn_cb_rej") ||
	    user_callback_handle_rxflow(wsi->a.protocol->callback, wsi,
			LWS_CALLBACK_CONNECTING, wsi->user_space,
			(void *)(intptr_t)wsi->desc.sockfd, 0)) {
		lwsl_wsi_info(wsi, "CONNECTION CB closed");
		goto failed1;
	}

#if defined(LWS_WITH_SYS_FAULT_INJECTION)
	cfail = lws_fi(&wsi->fic, "connfail");
	if (cfail)
		m = -1;
	else
#endif
		m = connect(wsi->desc.sockfd, (const struct sockaddr *)psa,
			    (socklen_t)n);

#if defined(LWS_WITH_CONMON)
	wsi->conmon_datum = lws_now_usecs();
	wsi->conmon.ciu_sockconn = 0;
#endif

	if (m == -1) {
		/*
		 * Since we're nonblocking, connect not having completed is not
		 * necessarily indicating any problem... we have to look at
		 * either errno or the socket to understand if we actually
		 * failed already...
		 */

		int errno_copy = LWS_ERRNO;

#if defined(LWS_WITH_SYS_FAULT_INJECTION)
		if (cfail)
			/* fake an abnormal, fatal situation */
			errno_copy = 999;
#endif

		lwsl_wsi_debug(wsi, "connect: fd %d errno: %d",
				wsi->desc.sockfd, errno_copy);

		if (errno_copy &&
		    errno_copy != LWS_EALREADY &&
		    errno_copy != LWS_EINPROGRESS &&
		    errno_copy != LWS_EWOULDBLOCK
#ifdef _WIN32
		 && errno_copy != WSAEINVAL
                 && errno_copy != WSAEISCONN
#endif
		) {
			/*
			 * The connect() failed immediately...
			 */

#if defined(LWS_WITH_CONMON)
			wsi->conmon.ciu_sockconn = (lws_conmon_interval_us_t)
					(lws_now_usecs() - wsi->conmon_datum);
#endif

			lws_metrics_caliper_report(wsi->cal_conn, METRES_NOGO);

#if defined(_DEBUG)
#if defined(LWS_WITH_UNIX_SOCK)
			if (!wsi->unix_skt) {
#endif

			char nads[48];

			lws_sa46_write_numeric_address(&wsi->sa46_peer, nads,
						       sizeof(nads));

			wsi->sa46_peer.sa4.sin_family = 0;
			lwsl_wsi_info(wsi, "Connect failed: %s port %d (errno %d)",
					   nads, port, errno_copy);
#if defined(LWS_WITH_UNIX_SOCK)
			}
#endif
#endif

			goto try_next_dns_result_fds;
		}

#if defined(WIN32)
		if (lws_plat_check_connection_error(wsi))
			goto try_next_dns_result_fds;

		if (errno_copy == WSAEISCONN)
			goto conn_good;
#endif

		/*
		 * The connection attempt is ongoing asynchronously... let's set
		 * a specialized timeout for this connect attempt completion, it
		 * uses wsi->sul_connect_timeout just for this purpose
		 */

		lws_sul_schedule(wsi->a.context, 0, &wsi->sul_connect_timeout,
				 lws_client_conn_wait_timeout,
				 wsi->a.context->timeout_secs *
						 LWS_USEC_PER_SEC);

		/*
		 * must do specifically a POLLOUT poll to hear
		 * about the connect completion
		 */
		if (lws_change_pollfd(wsi, 0, LWS_POLLOUT))
			goto try_next_dns_result_fds;

		return wsi;
	}

conn_good:

	/*
	 * The connection has happened
	 */

#if defined(LWS_WITH_CONMON)
	wsi->conmon.ciu_sockconn = (lws_conmon_interval_us_t)
					(lws_now_usecs() - wsi->conmon_datum);
#endif

#if !defined(LWS_PLAT_OPTEE)
	{
		socklen_t salen = sizeof(wsi->sa46_local);
#if defined(_DEBUG)
		char buf[64];
#endif
		if (getsockname((int)wsi->desc.sockfd,
				(struct sockaddr *)&wsi->sa46_local,
				&salen) == -1)
			lwsl_warn("getsockname: %s\n", strerror(LWS_ERRNO));
#if defined(_DEBUG)
#if defined(LWS_WITH_UNIX_SOCK)
		if (wsi->unix_skt)
			buf[0] = '\0';
		else
#endif
			lws_sa46_write_numeric_address(&wsi->sa46_local, buf, sizeof(buf));

		lwsl_wsi_info(wsi, "source ads %s", buf);
#endif
	}
#endif

	lws_sul_cancel(&wsi->sul_connect_timeout);
	lws_metrics_caliper_report(wsi->cal_conn, METRES_GO);

	lws_addrinfo_clean(wsi);

	if (wsi->a.protocol)
		wsi->a.protocol->callback(wsi, LWS_CALLBACK_WSI_CREATE,
					  wsi->user_space, NULL, 0);

	lwsl_wsi_debug(wsi, "going into connect_4");

	return lws_client_connect_4_established(wsi, NULL, plen);

oom4:
	/*
	 * We get here if we're trying to clean up a connection attempt that
	 * didn't make it as far as getting inserted into the wsi / fd tables
	 */

	if (lwsi_role_client(wsi) && wsi->a.protocol
				/* && lwsi_state_est(wsi) */)
		lws_inform_client_conn_fail(wsi,(void *)cce, strlen(cce));

	/* take care that we might be inserted in fds already */
	if (wsi->position_in_fds_table != LWS_NO_FDS_POS)
		/* do the full wsi close flow */
		goto failed1;

	lws_metrics_caliper_report(wsi->cal_conn, METRES_NOGO);

	/*
	 * We can't be an active client connection any more, if we thought
	 * that was what we were going to be doing.  It should be if we are
	 * failing by oom4 path, we are still called by
	 * lws_client_connect_via_info() and will be returning NULL to that,
	 * so nobody else should have had a chance to queue on us.
	 */
	{
		struct lws_vhost *vhost = wsi->a.vhost;
		lws_sockfd_type sfd = wsi->desc.sockfd;

		//lws_vhost_lock(vhost);
		__lws_free_wsi(wsi); /* acquires vhost lock in wsi reset */
		//lws_vhost_unlock(vhost);

		sanity_assert_no_wsi_traces(vhost->context, wsi);
		sanity_assert_no_sockfd_traces(vhost->context, sfd);
	}

	return NULL;

connect_to:
	/*
	 * It looks like the sul_connect_timeout fired
	 */
	lwsl_wsi_info(wsi, "abandoning connect due to timeout");

try_next_dns_result_fds:
	lws_pt_lock(pt, __func__);
	__remove_wsi_socket_from_fds(wsi);
	lws_pt_unlock(pt);

try_next_dns_result_closesock:
	/*
	 * We are killing the socket but leaving
	 */
	compatible_close(wsi->desc.sockfd);
	wsi->desc.sockfd = LWS_SOCK_INVALID;

try_next_dns_result:
	lws_sul_cancel(&wsi->sul_connect_timeout);
	if (lws_dll2_get_head(&wsi->dns_sorted_list))
		goto next_dns_result;

	lws_addrinfo_clean(wsi);
	cce = "Unable to connect";
	lws_inform_client_conn_fail(wsi, (void *)cce, strlen(cce));

failed1:
	lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "client_connect3");

	return NULL;
}